

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Type a,Type b)

{
  bool bVar1;
  uint uVar2;
  HeapType this_00;
  HeapType a_00;
  uintptr_t uVar3;
  Type b_00;
  uintptr_t extraout_RDX;
  uintptr_t extraout_RDX_00;
  HeapType b_01;
  uintptr_t *puVar4;
  long *plVar5;
  ulong uVar6;
  Type local_30;
  Type b_local;
  Type a_local;
  
  if (this == (SubTyper *)0x1 || this == (SubTyper *)a.id) {
    return true;
  }
  local_30.id = a.id;
  b_local.id = (uintptr_t)this;
  if (((ulong)this & 1) == 0 || this < (SubTyper *)0x7) {
    if (((((ulong)this & 1) == 0 && (SubTyper *)0x6 < this) && ((a.id & 1) == 0 && 6 < a.id)) &&
       (((byte)this >> 1 & (a.id & 2) == 0) == 0)) {
      this_00 = wasm::Type::getHeapType(&b_local);
      a_00 = wasm::Type::getHeapType(&local_30);
      bVar1 = wasm::Type::isExact(&local_30);
      b_01.id = extraout_RDX;
      if (bVar1) {
        bVar1 = wasm::Type::isExact(&b_local);
        if (bVar1) {
          return this_00.id == a_00.id;
        }
        if (0x7c < this_00.id) {
          return false;
        }
        uVar2 = (uint)this_00.id & 0x7b;
        b_01.id = extraout_RDX_00;
        if (4 < (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10) {
          return false;
        }
      }
      bVar1 = isSubType((SubTyper *)this_00.id,a_00,b_01);
      return bVar1;
    }
  }
  else if ((a.id & 1) != 0 && 6 < a.id) {
    puVar4 = (uintptr_t *)((ulong)this & 0xfffffffffffffffe);
    plVar5 = (long *)(a.id & 0xfffffffffffffffe);
    uVar3 = *puVar4;
    b_00.id = puVar4[1];
    if (b_00.id - uVar3 == plVar5[1] - *plVar5) {
      if (b_00.id == uVar3) {
        return true;
      }
      uVar6 = 0;
      do {
        bVar1 = isSubType(*(SubTyper **)(uVar3 + uVar6 * 8),
                          (Type)*(uintptr_t *)(*plVar5 + uVar6 * 8),b_00);
        if (!bVar1) {
          return bVar1;
        }
        uVar6 = uVar6 + 1;
        uVar3 = *puVar4;
        b_00.id = puVar4[1] - uVar3 >> 3;
      } while (uVar6 < b_00.id);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool SubTyper::isSubType(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a == Type::unreachable) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return isSubType(a.getTuple(), b.getTuple());
  }
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.isNullable() && !b.isNullable()) {
    return false;
  }
  auto heapTypeA = a.getHeapType();
  auto heapTypeB = b.getHeapType();
  if (b.isExact()) {
    if (a.isExact()) {
      return heapTypeA == heapTypeB;
    }
    if (!heapTypeA.isBottom()) {
      return false;
    }
  }
  return isSubType(heapTypeA, heapTypeB);
}